

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void MeCab::remove_pathname(string *s)

{
  long lVar1;
  ulong uVar2;
  string local_30 [32];
  
  uVar2 = s->_M_string_length & 0xffffffff;
  do {
    if ((int)uVar2 < 1) {
      std::__cxx11::string::assign((char *)s);
      return;
    }
    lVar1 = uVar2 - 1;
    uVar2 = uVar2 - 1;
  } while ((s->_M_dataplus)._M_p[lVar1] != '/');
  std::__cxx11::string::substr((ulong)local_30,(ulong)s);
  std::__cxx11::string::operator=((string *)s,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void remove_pathname(std::string *s) {
  int len = static_cast<int>(s->size()) - 1;
  bool ok = false;
  for (; len >= 0; --len) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    if ((*s)[len] == '\\') {
      ok = true;
      break;
    }
#else
    if ((*s)[len] == '/')  {
      ok = true;
      break;
    }
#endif
  }
  if (ok)
    *s = s->substr(len + 1, s->size() - len);
  else
    *s = ".";
}